

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O2

String * capnp::compiler::expressionString(Reader name)

{
  Reader exp;
  String *in_RDI;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  undefined8 in_stack_00000018;
  undefined8 in_stack_00000020;
  undefined8 in_stack_00000028;
  undefined8 in_stack_00000030;
  StringTree local_48;
  
  exp._reader.capTable = (CapTableReader *)in_stack_00000010;
  exp._reader.segment = (SegmentReader *)in_stack_00000008;
  exp._reader.data = (void *)in_stack_00000018;
  exp._reader.pointers = (WirePointer *)in_stack_00000020;
  exp._reader._32_8_ = in_stack_00000028;
  exp._reader._40_8_ = in_stack_00000030;
  expressionStringTree(exp);
  kj::StringTree::flatten(in_RDI,&local_48);
  kj::StringTree::~StringTree(&local_48);
  return in_RDI;
}

Assistant:

static kj::String expressionString(Expression::Reader name) {
  return expressionStringTree(name).flatten();
}